

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

qint64 __thiscall
QHttpNetworkReplyPrivate::readBodyVeryFast(QHttpNetworkReplyPrivate *this,QIODevice *socket,char *b)

{
  long lVar1;
  long lVar2;
  
  lVar1 = QIODevice::read((char *)socket,(longlong)b);
  if ((lVar1 != -1) &&
     (lVar2 = this->contentRead + lVar1, this->contentRead = lVar2, lVar2 == this->bodyLength)) {
    this->state = AllDoneState;
  }
  return lVar1;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readBodyVeryFast(QIODevice *socket, char *b)
{
    // This first read is to flush the buffer inside the socket
    qint64 haveRead = 0;
    haveRead = socket->read(b, bodyLength - contentRead);
    if (haveRead == -1) {
        return -1;
    }
    contentRead += haveRead;

    if (contentRead == bodyLength) {
        state = AllDoneState;
    }

    return haveRead;
}